

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintLen(char *string,UNITY_UINT32 length)

{
  char cVar1;
  char *pch;
  int __c;
  long lVar2;
  
  if (string != (char *)0x0) {
    lVar2 = 0;
    while( true ) {
      cVar1 = string[lVar2];
      __c = (int)cVar1;
      if ((cVar1 == '\0') || (length <= (uint)lVar2)) break;
      if ((byte)(cVar1 - 0x20U) < 0x5f) {
LAB_00101a39:
        putchar(__c);
      }
      else {
        putchar(0x5c);
        if (cVar1 == '\n') {
          __c = 0x6e;
          goto LAB_00101a39;
        }
        if (cVar1 == '\r') {
          __c = 0x72;
          goto LAB_00101a39;
        }
        putchar(0x78);
        UnityPrintNumberHex((long)string[lVar2],'\x02');
      }
      lVar2 = lVar2 + 1;
    }
  }
  return;
}

Assistant:

void UnityPrintLen(const char* string, const UNITY_UINT32 length)
{
    const char* pch = string;

    if (pch != NULL)
    {
        while (*pch && (UNITY_UINT32)(pch - string) < length)
        {
            /* printable characters plus CR & LF are printed */
            if ((*pch <= 126) && (*pch >= 32))
            {
                UNITY_OUTPUT_CHAR(*pch);
            }
            /* write escaped carriage returns */
            else if (*pch == 13)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('r');
            }
            /* write escaped line feeds */
            else if (*pch == 10)
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('n');
            }
            /* unprintable characters are shown as codes */
            else
            {
                UNITY_OUTPUT_CHAR('\\');
                UNITY_OUTPUT_CHAR('x');
                UnityPrintNumberHex((UNITY_UINT)*pch, 2);
            }
            pch++;
        }
    }
}